

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall
TTD::SnapshotExtractor::ExtractScriptFunctionEnvironmentIfNeeded
          (SnapshotExtractor *this,ScriptFunction *function)

{
  uint16 uVar1;
  FrameDisplay *this_00;
  ScriptContext *ctx;
  FrameDisplay *environment;
  ScriptFunction *function_local;
  SnapshotExtractor *this_local;
  
  this_00 = Js::ScriptFunction::GetEnvironment(function);
  uVar1 = Js::FrameDisplay::GetLength(this_00);
  if (uVar1 != 0) {
    ctx = Js::RecyclableObject::GetScriptContext((RecyclableObject *)function);
    ExtractScopeIfNeeded(this,ctx,this_00);
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractScriptFunctionEnvironmentIfNeeded(Js::ScriptFunction* function)
    {
        Js::FrameDisplay* environment = function->GetEnvironment();
        if(environment->GetLength() != 0)
        {
            this->ExtractScopeIfNeeded(function->GetScriptContext(), environment);
        }
    }